

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O3

pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> * __thiscall
docopt::Command::single_match
          (pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> *__return_storage_ptr__,
          Command *this,PatternList *left)

{
  element_type *peVar1;
  undefined8 __n;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> *ppVar4;
  int iVar5;
  long lVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer psVar7;
  unsigned_long uVar8;
  long lVar9;
  undefined8 __s1;
  bool bVar10;
  undefined1 local_a0 [8];
  undefined1 local_98 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  undefined1 local_68 [8];
  undefined8 uStack_60;
  element_type *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> *local_48;
  Command *local_40;
  undefined1 local_31;
  
  __return_storage_ptr__->first = 0;
  (__return_storage_ptr__->second).
  super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->second).
  super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  psVar7 = (left->
           super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar9 = (long)(left->
                super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)psVar7;
  local_48 = __return_storage_ptr__;
  if (lVar9 != 0) {
    lVar9 = lVar9 >> 4;
    uVar8 = 0;
    local_40 = this;
    do {
      peVar1 = (psVar7->super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if ((peVar1 != (element_type *)0x0) &&
         (lVar6 = __dynamic_cast(peVar1,&Pattern::typeinfo,&Argument::typeinfo,0), lVar6 != 0)) {
        iVar5 = (*(local_40->super_Argument).super_LeafPattern.super_Pattern._vptr_Pattern[3])();
        lVar9 = *(long *)CONCAT44(extraout_var,iVar5);
        local_78._M_allocated_capacity = (size_type)local_68;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_78,lVar9,((long *)CONCAT44(extraout_var,iVar5))[1] + lVar9);
        __n = local_78._8_8_;
        local_a0._0_4_ = String;
        __s1 = local_78._M_allocated_capacity;
        if ((undefined1 *)local_78._M_allocated_capacity == local_68) {
          local_98._24_8_ = uStack_60;
          __s1 = (pointer)(local_98 + 0x10);
        }
        local_98._8_8_ = local_78._8_8_;
        local_78._8_8_ = 0;
        local_68[0] = 0;
        local_98._0_8_ = __s1;
        if ((*(int *)(lVar6 + 0x28) == 3) && (__n == *(size_t *)(lVar6 + 0x38))) {
          if (__n == 0) {
            bVar10 = true;
            local_78._M_allocated_capacity = (size_type)local_68;
          }
          else {
            local_78._M_allocated_capacity = (size_type)local_68;
            iVar5 = bcmp((void *)__s1,*(void **)(lVar6 + 0x30),__n);
            bVar10 = iVar5 == 0;
          }
        }
        else {
          bVar10 = false;
          local_78._M_allocated_capacity = (size_type)local_68;
        }
        if ((pointer)__s1 != (pointer)(local_98 + 0x10)) {
          operator_delete((void *)__s1);
        }
        if ((undefined1 *)local_78._M_allocated_capacity != local_68) {
          operator_delete((void *)local_78._M_allocated_capacity);
        }
        ppVar4 = local_48;
        if (!bVar10) {
          return local_48;
        }
        local_48->first = uVar8;
        iVar5 = (*(local_40->super_Argument).super_LeafPattern.super_Pattern._vptr_Pattern[3])();
        local_a0._0_4_ = Bool;
        local_98[0] = 1;
        local_58 = (element_type *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<docopt::Command,std::allocator<docopt::Command>,std::__cxx11::string_const&,docopt::value>
                  (&_Stack_50,(Command **)&local_58,(allocator<docopt::Command> *)&local_31,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(extraout_var_00,iVar5),(value *)local_a0);
        _Var3._M_pi = _Stack_50._M_pi;
        peVar2 = local_58;
        local_58 = (element_type *)0x0;
        _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        (ppVar4->second).super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = peVar2;
        (ppVar4->second).super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = _Var3._M_pi;
        if (local_a0._0_4_ == StringList) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_98);
          return local_48;
        }
        if (local_a0._0_4_ != String) {
          return local_48;
        }
        if ((pointer)local_98._0_8_ == (pointer)(local_98 + 0x10)) {
          return local_48;
        }
        operator_delete((void *)local_98._0_8_);
        return local_48;
      }
      uVar8 = uVar8 + 1;
      psVar7 = psVar7 + 1;
    } while (lVar9 + (ulong)(lVar9 == 0) != uVar8);
  }
  return local_48;
}

Assistant:

inline std::pair<size_t, std::shared_ptr<LeafPattern>> Command::single_match(PatternList const& left) const
	{
		std::pair<size_t, std::shared_ptr<LeafPattern>> ret {};

		for(size_t i = 0, size = left.size(); i < size; ++i)
		{
			auto arg = dynamic_cast<Argument const*>(left[i].get());
			if (arg) {
				if (name() == arg->getValue()) {
					ret.first = i;
					ret.second = std::make_shared<Command>(name(), value{true});
				}
				break;
			}
		}

		return ret;
	}